

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> * __thiscall
tinyusdz::GeomMesh::get_joints
          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__return_storage_ptr__,
          GeomMesh *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  mapped_type *this_01;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *pvVar5;
  bool bVar6;
  key_type local_68;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_48;
  
  this_00 = &(this->super_GPrim).props;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"skel:joints","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::find(&this_00->_M_t,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar4._M_node !=
      &(this->super_GPrim).props._M_t._M_impl.super__Rb_tree_header) {
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"skel:joints","");
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::at(this_00,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((this_01->_attrib)._variability == Uniform) {
      Attribute::type_name_abi_cxx11_(&local_68,&this_01->_attrib);
      iVar3 = std::__cxx11::string::compare((char *)&local_68);
      bVar6 = iVar3 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = Attribute::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                        (&this_01->_attrib,&local_48);
      pvVar5 = __return_storage_ptr__;
      if (bVar2) {
        (__return_storage_ptr__->
        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
        super__Vector_impl_data._M_start =
             local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->
        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->
        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_48.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        pvVar5 = &local_48;
      }
      (pvVar5->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar5->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar5->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_48);
      if (bVar6) {
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<value::token> GeomMesh::get_joints() const {
  constexpr auto kSkelJoints = "skel:joints";
#if 0
  if (has_primvar(kSkelJoints)) {
    // 'primvars:skel:joints'
    std::string err;
    GeomPrimvar primvar;
    if (!get_primvar(kSkelJoints, &primvar, &err)) {
      DCOUT("Invalid `skel:joints` primvar. err = " << err);
      return {};
    }

    if (primvar.has_indices()) {
      // indexed primvar for skel:joint is not supported 
      DCOUT("Indexed primvar is not supported for `skel:joints`");
      return {};
    }

    const Attribute &attr = primvar.get_attribute();
    if (!attr.is_uniform()) {
      DCOUT("`skel:joints` must be uniform attribute");
      return {};
    }

    std::vector<value::token> dst;
    if (!primvar.get_value(&dst)) {
      DCOUT("`skel:joints` must be token[] type, but got " << primvar.type_name());
    }
  } else {
#endif
  {
    // lookup `skel:joints` prop
    if (!props.count(kSkelJoints)) {
      return {};
    }

    const auto &prop = props.at(kSkelJoints);
    if (prop.get_attribute().is_uniform() && prop.get_attribute().type_name() == "token[]") {
      
      std::vector<value::token> dst;
      if (!prop.get_attribute().get_value(&dst)) {
        return {};
      }

      return dst;
      
    } 
    DCOUT("`skel:joints` must be uniform token[] attribute, but got " << prop.value_type_name() << " (or Relationship))");
  }
  return {};
}

// static
bool GeomSubset::ValidateSubsets(
    const std::vector<const GeomSubset *> &subsets,
    const size_t elementCount,
    const FamilyType &familyType, std::string *err) {

  if (subsets.empty()) {
    return true;
  }

  // All subsets must have the same elementType.
  GeomSubset::ElementType elementType = subsets[0]->elementType.get_value();
  for (const auto psubset : subsets) {
    if (psubset->elementType.get_value() != elementType) {
      if (err) {
        (*err) = fmt::format("GeomSubset {}'s elementType must be `{}`, but got `{}`.\n",
          psubset->name, to_string(elementType), to_string(psubset->elementType.get_value()));
      }

      return false;
    }
  }

  std::set<int32_t> indicesInFamily;

  bool valid = true;
  std::stringstream ss;

  // TODO: TimeSampled indices
  for (const auto psubset : subsets) {
    Animatable<std::vector<int32_t>> indices;
    if (!psubset->indices.get_value(&indices)) {
      ss << fmt::format("GeomSubset {}'s indices is not value Attribute. Connection or ValueBlock?\n",
          psubset->name);

      valid = false;
    }

    if (indices.is_blocked()) {
      ss << fmt::format("GeomSubset {}'s indices is Value Blocked.\n", psubset->name);
      valid = false;
    }

    if (indices.is_timesamples() || !indices.has_value()) {
      ss << fmt::format("ValidateSubsets: TimeSampled GeomSubset.indices is not yet supported.\n");
      valid = false;
    }

    std::vector<int32_t> subsetIndices;
    if (!indices.get_scalar(&subsetIndices)) {
      ss << fmt::format("ValidateSubsets: Internal error. Failed to get GeomSubset.indices.\n");
      valid = false;
    }

    for (const int32_t index : subsetIndices) {
      if (!indicesInFamily.insert(index).second && (familyType != FamilyType::Unrestricted)) {
        ss << fmt::format("Found overlapping index {} in GeomSubset `{}`\n", index, psubset->name);
        valid = false;
      }
    }
  }


  // Make sure every index appears exactly once if it's a partition.
  if ((familyType == FamilyType::Partition) && (indicesInFamily.size() != elementCount)) {
    ss << fmt::format("ValidateSubsets: The number of unique indices {} must be equal to input elementCount {}\n", indicesInFamily.size(), elementCount);
    valid = false;
  }

  // Ensure that the indices are in the range [0, faceCount)
  size_t maxIndex = static_cast<size_t>(*indicesInFamily.rbegin());
  int minIndex = *indicesInFamily.begin();

  if (maxIndex >= elementCount) {
    ss << fmt::format("ValidateSubsets: All indices must be in range [0, elementSize {}), but one or more indices are greater than elementSize. Maximum = {}\n", elementCount, maxIndex);

    valid = false;
  }

  if (minIndex < 0) {
    ss << fmt::format("ValidateSubsets: Found one or more indices that are less than 0. Minumum = {}\n", minIndex);

    valid = false;
  }

  if (!valid) {
    if (err) {
      (*err) += ss.str();
    }
  }

  return true;

}

}